

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_l_val(SyntaxAnalyze *this,ValueMode mode)

{
  bool bVar1;
  bool bVar2;
  OperationType OVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  size_type sVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  irGenerator *this_00;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  int *in_RSI;
  element_type *in_RDI;
  SharedExNdPtr SVar15;
  string arrPtr;
  string valueTmp;
  SharedExNdPtr value_1;
  string addrTmp;
  SharedExNdPtr addr_1;
  SharedSyPtr var;
  string value;
  SharedExNdPtr loadValue;
  SharedExNdPtr constValue;
  SharedExNdPtr addr;
  SharedExNdPtr child;
  SharedExNdPtr index;
  SharedSyPtr arr;
  string name;
  SharedExNdPtr *node;
  ExpressNode *in_stack_fffffffffffff358;
  undefined4 in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff364;
  shared_ptr<front::symbol::Symbol> *in_stack_fffffffffffff368;
  SyntaxAnalyze *in_stack_fffffffffffff370;
  undefined4 in_stack_fffffffffffff378;
  uint uVar16;
  undefined4 in_stack_fffffffffffff37c;
  ExpressNode *in_stack_fffffffffffff380;
  uint32_t in_stack_fffffffffffff3bc;
  string *in_stack_fffffffffffff3c0;
  irGenerator *in_stack_fffffffffffff3c8;
  byte local_c1d;
  undefined8 in_stack_fffffffffffff3f8;
  string *in_stack_fffffffffffff400;
  irGenerator *in_stack_fffffffffffff408;
  RightVal *in_stack_fffffffffffff4a0;
  LeftVal *in_stack_fffffffffffff4a8;
  LeftVal *pLVar17;
  irGenerator *in_stack_fffffffffffff4b0;
  irGenerator *piVar18;
  undefined8 in_stack_fffffffffffff4c8;
  SyntaxAnalyze *in_stack_fffffffffffff4d0;
  undefined8 in_stack_fffffffffffff4e0;
  TyKind TVar19;
  SyntaxAnalyze *in_stack_fffffffffffff4e8;
  undefined1 begin;
  LeftVal *in_stack_fffffffffffff4f0;
  LeftVal *in_stack_fffffffffffff4f8;
  string *this_01;
  irGenerator *in_stack_fffffffffffff500;
  byte local_979;
  byte local_971;
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [112];
  string local_810 [32];
  string local_7f0 [119];
  byte local_779;
  string local_768 [32];
  string local_748 [48];
  SharedExNdPtr *in_stack_fffffffffffff8e8;
  SharedSyPtr *in_stack_fffffffffffff8f0;
  SyntaxAnalyze *in_stack_fffffffffffff8f8;
  string local_6c8 [32];
  string local_6a8 [128];
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [112];
  undefined1 local_518 [32];
  string local_4f8 [32];
  string local_4d8 [128];
  undefined1 local_458 [16];
  undefined1 local_448 [48];
  string local_418 [32];
  undefined1 local_3f8 [48];
  string local_3c8 [64];
  string local_388 [48];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [144];
  string local_268 [32];
  string local_248 [119];
  byte local_1d1;
  byte local_169;
  string local_168 [39];
  byte local_141;
  string local_140 [48];
  string local_110 [39];
  byte local_e9;
  string local_98 [48];
  string local_68 [32];
  string local_48 [51];
  byte local_15;
  int local_14;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffff3f8 >> 0x20);
  local_15 = 0;
  local_14 = in_EDX;
  operator_new(0x48);
  express::ExpressNode::ExpressNode(in_stack_fffffffffffff380);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
            ((shared_ptr<front::express::ExpressNode> *)
             CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),in_stack_fffffffffffff358
            );
  std::__cxx11::string::string(local_48);
  match_one_word(in_stack_fffffffffffff4d0,(Token)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
  get_least_matched_word((SyntaxAnalyze *)0x2a7fe8);
  word::Word::get_self_abi_cxx11_((Word *)in_stack_fffffffffffff358);
  std::__cxx11::string::operator=(local_48,local_68);
  std::__cxx11::string::~string(local_68);
  bVar1 = try_word(in_stack_fffffffffffff370,(int)((ulong)in_stack_fffffffffffff368 >> 0x20),
                   (Token)in_stack_fffffffffffff368);
  TVar19 = (TyKind)((ulong)in_stack_fffffffffffff4e0 >> 0x20);
  if (bVar1) {
    std::__cxx11::string::string(local_98,local_48);
    symbolTable::SymbolTable::find_least_layer_symbol
              ((SymbolTable *)CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378),
               (string *)in_stack_fffffffffffff370);
    std::__cxx11::string::~string(local_98);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a80c7);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a80d4);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a80e1);
    peVar10 = std::
              __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a80ee);
    peVar10->_type = VAR;
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              (in_stack_fffffffffffff368);
    peVar12 = std::
              __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a811e);
    local_e9 = 0;
    bVar1 = symbol::ArraySymbol::isParam(peVar12);
    local_971 = 1;
    if (!bVar1) {
      peVar8 = std::
               __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a815f);
      iVar4 = symbol::Symbol::getLayerNum(peVar8);
      local_979 = 0;
      if (iVar4 != *in_RSI) {
        std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                  (in_stack_fffffffffffff368);
        local_e9 = 1;
        peVar12 = std::
                  __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a81be);
        bVar1 = symbol::ArraySymbol::isConst(peVar12);
        local_979 = bVar1 ^ 0xff;
      }
      local_971 = local_979;
    }
    OVar3 = ARR;
    if ((local_971 & 1) != 0) {
      OVar3 = PTR;
    }
    peVar10 = std::
              __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a8218);
    peVar10->_operation = OVar3;
    if ((local_e9 & 1) != 0) {
      std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                ((shared_ptr<front::symbol::ArraySymbol> *)0x2a823b);
    }
    std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
              ((shared_ptr<front::symbol::ArraySymbol> *)0x2a8248);
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              (in_stack_fffffffffffff368);
    peVar12 = std::
              __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a8272);
    local_141 = 0;
    local_169 = 0;
    bVar1 = symbol::ArraySymbol::isConst(peVar12);
    if (bVar1) {
      std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a82c4);
      symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
      local_141 = 1;
      peVar8 = std::
               __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a82eb);
      symbol::Symbol::getId(peVar8);
      irGenerator::irGenerator::getConstName
                (in_stack_fffffffffffff408,in_stack_fffffffffffff400,iVar5);
    }
    else {
      std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a8348);
      symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
      local_169 = 1;
      peVar8 = std::
               __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a836f);
      symbol::Symbol::getId(peVar8);
      irGenerator::irGenerator::getVarName
                (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
    }
    peVar10 = std::
              __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a83b5);
    std::__cxx11::string::operator=((string *)&peVar10->_name,local_110);
    std::__cxx11::string::~string(local_110);
    if ((local_169 & 1) != 0) {
      std::__cxx11::string::~string(local_168);
    }
    if ((local_141 & 1) != 0) {
      std::__cxx11::string::~string(local_140);
    }
    std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
              ((shared_ptr<front::symbol::ArraySymbol> *)0x2a8415);
    while( true ) {
      bVar1 = try_word(in_stack_fffffffffffff370,(int)((ulong)in_stack_fffffffffffff368 >> 0x20),
                       (Token)in_stack_fffffffffffff368);
      TVar19 = (TyKind)((ulong)in_stack_fffffffffffff4e0 >> 0x20);
      if (!bVar1) break;
      match_one_word(in_stack_fffffffffffff4d0,(Token)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
      gm_exp(in_stack_fffffffffffff4e8);
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)
                 CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a84a2);
      std::
      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a84af);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)
                 CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
      express::ExpressNode::addChild
                ((ExpressNode *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                 (SharedExNdPtr *)in_stack_fffffffffffff358);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a84f8);
      match_one_word(in_stack_fffffffffffff4d0,(Token)((ulong)in_stack_fffffffffffff4c8 >> 0x20));
    }
    std::shared_ptr<front::symbol::Symbol>::shared_ptr
              ((shared_ptr<front::symbol::Symbol> *)
               CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
               (shared_ptr<front::symbol::Symbol> *)in_stack_fffffffffffff358);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)
               CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
    computeIndex(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)
               CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
               (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a871c);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a8729);
    std::shared_ptr<front::symbol::Symbol>::~shared_ptr
              ((shared_ptr<front::symbol::Symbol> *)0x2a8736);
    local_1d1 = 0;
    bVar1 = true;
    if (local_14 != 1) {
      peVar10 = std::
                __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2a8760);
      sVar6 = std::
              vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ::size(&peVar10->_children);
      std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                (in_stack_fffffffffffff368);
      local_1d1 = 1;
      peVar12 = std::
                __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2a879e);
      sVar7 = std::
              vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ::size(&peVar12->_dimensions);
      bVar1 = sVar6 < sVar7;
    }
    if ((local_1d1 & 1) != 0) {
      std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                ((shared_ptr<front::symbol::ArraySymbol> *)0x2a87e9);
    }
    if (bVar1) {
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)
                 CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
    }
    else {
      std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                (in_stack_fffffffffffff368);
      peVar12 = std::
                __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2a886d);
      bVar2 = symbol::ArraySymbol::isConst(peVar12);
      bVar1 = false;
      if (bVar2) {
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a88a2);
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360));
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a88b6);
        bVar1 = peVar10->_type == CNS;
      }
      std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                ((shared_ptr<front::symbol::ArraySymbol> *)0x2a88de);
      if (bVar1) {
        std::shared_ptr<front::express::ExpressNode>::shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a88fb);
        operator_new(0x48);
        express::ExpressNode::ExpressNode(in_stack_fffffffffffff380);
        std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
                  ((shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   in_stack_fffffffffffff358);
        std::shared_ptr<front::express::ExpressNode>::operator=
                  ((shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a8967);
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a8974);
        peVar10->_type = CNS;
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a8987);
        peVar10->_operation = NUMBER;
        std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                  (in_stack_fffffffffffff368);
        std::
        __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a89b8);
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a89d1);
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360));
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a89e5);
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::front((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360));
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a89f9);
        std::
        vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
        ::at((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
             (size_type)in_stack_fffffffffffff358);
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a8a21);
        iVar5 = peVar10->_value;
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a8a38);
        peVar10->_value = iVar5;
        std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                  ((shared_ptr<front::symbol::ArraySymbol> *)0x2a8a4f);
        std::shared_ptr<front::express::ExpressNode>::operator=
                  ((shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a8a71);
      }
      else {
        std::shared_ptr<front::express::ExpressNode>::shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a8b1a);
        std::__cxx11::string::string(local_248);
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  ((irGenerator *)in_stack_fffffffffffff4e8,TVar19);
        std::__cxx11::string::operator=(local_248,local_268);
        std::__cxx11::string::~string(local_268);
        operator_new(0x48);
        express::ExpressNode::ExpressNode(in_stack_fffffffffffff380);
        std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
                  ((shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   in_stack_fffffffffffff358);
        std::shared_ptr<front::express::ExpressNode>::operator=
                  ((shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a8bda);
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a8be7);
        peVar10->_type = VAR;
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a8bfa);
        peVar10->_operation = LOAD;
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a8c0e);
        std::__cxx11::string::operator=((string *)&peVar10->_name,local_248);
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a8c31);
        std::shared_ptr<front::express::ExpressNode>::shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
        express::ExpressNode::addChild
                  ((ExpressNode *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (SharedExNdPtr *)in_stack_fffffffffffff358);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a8c7a);
        std::shared_ptr<front::express::ExpressNode>::operator=
                  ((shared_ptr<front::express::ExpressNode> *)
                   CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
        std::variant<int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff358);
        std::
        __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a8cc7);
        std::variant<int,int,std::__cxx11::string>::
        variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                  ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff358);
        irGenerator::irGenerator::ir_load
                  (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
        std::
        variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a8d09);
        std::
        variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x2a8d16);
        std::__cxx11::string::~string(local_248);
        std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                  ((shared_ptr<front::express::ExpressNode> *)0x2a8d30);
      }
    }
    if (local_14 == 1) {
      std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a8e3f);
      symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
      peVar8 = std::
               __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a8e5e);
      symbol::Symbol::getId(peVar8);
      irGenerator::irGenerator::getVarName
                (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
      bVar1 = optimization::bmir_variable_table::BmirVariableTable::hasNameKey
                        ((BmirVariableTable *)
                         CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                         (string *)in_stack_fffffffffffff358);
      std::__cxx11::string::~string(local_2f8);
      std::__cxx11::string::~string(local_318);
      if (bVar1) {
        std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a8f10);
        symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
        peVar8 = std::
                 __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a8f2f);
        symbol::Symbol::getId(peVar8);
        irGenerator::irGenerator::getVarName
                  (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
        optimization::bmir_variable_table::BmirVariableTable::getVarArray
                  ((BmirVariableTable *)
                   CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                   (string *)in_stack_fffffffffffff358);
        peVar13 = std::
                  __shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a8f92);
        peVar13->changed = true;
        std::__cxx11::string::~string(local_338);
        std::__cxx11::string::~string(local_358);
      }
    }
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a9052);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a905f);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a906c);
    std::shared_ptr<front::symbol::Symbol>::~shared_ptr
              ((shared_ptr<front::symbol::Symbol> *)0x2a9079);
  }
  else {
    std::__cxx11::string::string(local_388,local_48);
    symbolTable::SymbolTable::find_least_layer_symbol
              ((SymbolTable *)CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378),
               (string *)in_stack_fffffffffffff370);
    std::__cxx11::string::~string(local_388);
    peVar8 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a911b);
    iVar4 = (**peVar8->_vptr_Symbol)();
    if (iVar4 == 0) {
      std::static_pointer_cast<front::symbol::IntSymbol,front::symbol::Symbol>
                (in_stack_fffffffffffff368);
      peVar9 = std::
               __shared_ptr_access<front::symbol::IntSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::symbol::IntSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a9169);
      bVar1 = symbol::IntSymbol::isConst(peVar9);
      std::shared_ptr<front::symbol::IntSymbol>::~shared_ptr
                ((shared_ptr<front::symbol::IntSymbol> *)0x2a9187);
      if (bVar1) {
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a91a4);
        peVar10->_type = CNS;
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a91b7);
        peVar10->_operation = VAR;
        std::static_pointer_cast<front::symbol::IntSymbol,front::symbol::Symbol>
                  (in_stack_fffffffffffff368);
        peVar9 = std::
                 __shared_ptr_access<front::symbol::IntSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::symbol::IntSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a91e8);
        iVar5 = symbol::IntSymbol::getValue(peVar9);
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a9206);
        peVar10->_value = iVar5;
        std::shared_ptr<front::symbol::IntSymbol>::~shared_ptr
                  ((shared_ptr<front::symbol::IntSymbol> *)0x2a921d);
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a92ba);
        peVar10->_type = VAR;
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a92cd);
        peVar10->_operation = VAR;
        std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a92f8);
        symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
        peVar8 = std::
                 __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a9317);
        symbol::Symbol::getId(peVar8);
        irGenerator::irGenerator::getVarName
                  (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a935b);
        std::__cxx11::string::operator=((string *)&peVar10->_name,local_3c8);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::string::~string((string *)(local_3f8 + 0x10));
        peVar8 = std::
                 __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2a939e);
        iVar5 = symbol::Symbol::getLayerNum(peVar8);
        if (iVar5 == *in_RSI) {
          std::shared_ptr<front::express::ExpressNode>::shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)0x2a93d3);
          std::__cxx11::string::string(local_418);
          irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                    ((irGenerator *)in_stack_fffffffffffff4e8,TVar19);
          this_01 = (string *)(local_448 + 0x10);
          std::__cxx11::string::operator=(local_418,this_01);
          std::__cxx11::string::~string(this_01);
          this_00 = (irGenerator *)operator_new(0x48);
          express::ExpressNode::ExpressNode(in_stack_fffffffffffff380);
          std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
                    ((shared_ptr<front::express::ExpressNode> *)
                     CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     in_stack_fffffffffffff358);
          pLVar17 = (LeftVal *)local_3f8;
          piVar18 = (irGenerator *)local_448;
          std::shared_ptr<front::express::ExpressNode>::operator=
                    ((shared_ptr<front::express::ExpressNode> *)
                     CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
          std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)0x2a9496);
          peVar10 = std::
                    __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2a94a3);
          peVar10->_type = VAR;
          peVar10 = std::
                    __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2a94b6);
          peVar10->_operation = PTR;
          peVar10 = std::
                    __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2a94ca);
          std::__cxx11::string::operator=((string *)&peVar10->_name,local_418);
          std::
          __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a94ed);
          TVar19 = (TyKind)((ulong)local_458 >> 0x20);
          std::shared_ptr<front::express::ExpressNode>::shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)
                     CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
          express::ExpressNode::addChild
                    ((ExpressNode *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (SharedExNdPtr *)in_stack_fffffffffffff358);
          std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)0x2a9536);
          std::variant<int,std::__cxx11::string>::
          variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                    ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff358);
          std::
          __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a956e);
          std::variant<int,std::__cxx11::string>::
          variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                    ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff358);
          irGenerator::irGenerator::ir_ref
                    (this_00,(LeftVal *)this_01,pLVar17,SUB81((ulong)piVar18 >> 0x38,0));
          std::
          variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x2a95b2);
          std::
          variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x2a95bf);
          if (local_14 == 1) {
            std::shared_ptr<front::express::ExpressNode>::operator=
                      ((shared_ptr<front::express::ExpressNode> *)
                       CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
          }
          else {
            std::shared_ptr<front::express::ExpressNode>::shared_ptr
                      ((shared_ptr<front::express::ExpressNode> *)0x2a96cd);
            std::__cxx11::string::string(local_4d8);
            irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(piVar18,TVar19);
            std::__cxx11::string::operator=(local_4d8,local_4f8);
            std::__cxx11::string::~string(local_4f8);
            operator_new(0x48);
            express::ExpressNode::ExpressNode(in_stack_fffffffffffff380);
            std::shared_ptr<front::express::ExpressNode>::
            shared_ptr<front::express::ExpressNode,void>
                      ((shared_ptr<front::express::ExpressNode> *)
                       CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       in_stack_fffffffffffff358);
            piVar18 = (irGenerator *)(local_518 + 0x10);
            std::shared_ptr<front::express::ExpressNode>::operator=
                      ((shared_ptr<front::express::ExpressNode> *)
                       CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
            std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                      ((shared_ptr<front::express::ExpressNode> *)0x2a978d);
            peVar10 = std::
                      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2a979a);
            peVar10->_type = VAR;
            peVar10 = std::
                      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2a97ad);
            peVar10->_operation = LOAD;
            peVar10 = std::
                      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2a97c1);
            std::__cxx11::string::operator=((string *)&peVar10->_name,local_4d8);
            peVar10 = std::
                      __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2a97e4);
            pLVar17 = (LeftVal *)local_518;
            std::shared_ptr<front::express::ExpressNode>::shared_ptr
                      ((shared_ptr<front::express::ExpressNode> *)
                       CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
            express::ExpressNode::addChild
                      ((ExpressNode *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (SharedExNdPtr *)in_stack_fffffffffffff358);
            std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                      ((shared_ptr<front::express::ExpressNode> *)0x2a982d);
            std::
            __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a984e);
            std::variant<int,std::__cxx11::string>::
            variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                      ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff358);
            std::
            __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a9871);
            std::variant<int,int,std::__cxx11::string>::
            variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                      ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff358);
            irGenerator::irGenerator::ir_load(piVar18,pLVar17,(RightVal *)peVar10);
            std::
            variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2a98b3);
            std::
            variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2a98c0);
            std::shared_ptr<front::express::ExpressNode>::operator=
                      ((shared_ptr<front::express::ExpressNode> *)
                       CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffff358);
            std::__cxx11::string::~string(local_4d8);
            std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                      ((shared_ptr<front::express::ExpressNode> *)0x2a98ef);
          }
          std::__cxx11::string::~string(local_418);
          std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                    ((shared_ptr<front::express::ExpressNode> *)0x2a99d2);
        }
        if (local_14 == 1) {
          std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a9a34);
          symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
          peVar8 = std::
                   __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a9a53);
          symbol::Symbol::getId(peVar8);
          irGenerator::irGenerator::getVarName
                    (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
          bVar1 = optimization::bmir_variable_table::BmirVariableTable::hasVarSingle
                            ((BmirVariableTable *)
                             CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                             (string *)in_stack_fffffffffffff358);
          std::__cxx11::string::~string(local_588);
          std::__cxx11::string::~string(local_5a8);
          if (bVar1) {
            std::
            __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a9b05);
            symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
            peVar8 = std::
                     __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2a9b24);
            symbol::Symbol::getId(peVar8);
            irGenerator::irGenerator::getVarName
                      (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc
                      );
            optimization::bmir_variable_table::BmirVariableTable::getVarSingle
                      ((BmirVariableTable *)
                       CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (string *)in_stack_fffffffffffff358);
            peVar11 = std::
                      __shared_ptr_access<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x2a9b87);
            peVar11->changed = true;
            std::__cxx11::string::~string(local_5c8);
            std::__cxx11::string::~string(local_5e8);
          }
        }
      }
    }
    else {
      peVar8 = std::
               __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a9c51);
      iVar4 = (**peVar8->_vptr_Symbol)();
      if (iVar4 == 2) {
        std::__cxx11::string::string(local_608);
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_
                  ((irGenerator *)in_stack_fffffffffffff4e8,TVar19);
        begin = (undefined1)((ulong)in_stack_fffffffffffff4e8 >> 0x38);
        std::__cxx11::string::operator=(local_608,local_628);
        std::__cxx11::string::~string(local_628);
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a9ce1);
        peVar10->_type = VAR;
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a9cf4);
        peVar10->_operation = PTR;
        peVar10 = std::
                  __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a9d08);
        std::__cxx11::string::operator=((string *)&peVar10->_name,local_608);
        std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                  (in_stack_fffffffffffff368);
        peVar12 = std::
                  __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a9d48);
        bVar1 = symbol::ArraySymbol::isConst(peVar12);
        std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                  ((shared_ptr<front::symbol::ArraySymbol> *)0x2a9d66);
        if (bVar1) {
          std::variant<int,std::__cxx11::string>::
          variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                    ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff358);
          std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a9dc2);
          symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
          peVar8 = std::
                   __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2a9de1);
          symbol::Symbol::getId(peVar8);
          irGenerator::irGenerator::getConstName
                    (in_stack_fffffffffffff408,in_stack_fffffffffffff400,iVar5);
          std::variant<int,std::__cxx11::string>::
          variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                    ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff358);
          irGenerator::irGenerator::ir_ref
                    (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
                     (bool)begin);
          std::
          variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x2a9e63);
          std::__cxx11::string::~string(local_6a8);
          std::__cxx11::string::~string(local_6c8);
          std::
          variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x2a9e8a);
        }
        else {
          std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                    (in_stack_fffffffffffff368);
          peVar12 = std::
                    __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2a9f71);
          bVar1 = symbol::ArraySymbol::isParam(peVar12);
          std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                    ((shared_ptr<front::symbol::ArraySymbol> *)0x2a9f8f);
          if (bVar1) {
            std::variant<int,std::__cxx11::string>::
            variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                      ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff358);
            std::
            __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a9feb);
            symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
            peVar8 = std::
                     __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2aa00a);
            symbol::Symbol::getId(peVar8);
            irGenerator::irGenerator::getVarName
                      (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc
                      );
            std::variant<int,int,std::__cxx11::string>::
            variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                      ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff358);
            irGenerator::irGenerator::ir_assign
                      (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0
                      );
            std::
            variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2aa08a);
            std::__cxx11::string::~string(local_748);
            std::__cxx11::string::~string(local_768);
            std::
            variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2aa0b1);
          }
          else {
            peVar8 = std::
                     __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2aa162);
            local_779 = 0;
            iVar5 = symbol::Symbol::getLayerNum(peVar8);
            local_c1d = 0;
            if (iVar5 != *in_RSI) {
              std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                        (in_stack_fffffffffffff368);
              local_779 = 1;
              peVar12 = std::
                        __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x2aa1c9);
              bVar1 = symbol::ArraySymbol::isConst(peVar12);
              local_c1d = bVar1 ^ 0xff;
            }
            if ((local_779 & 1) != 0) {
              std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                        ((shared_ptr<front::symbol::ArraySymbol> *)0x2aa20e);
            }
            if ((local_c1d & 1) == 0) {
              std::variant<int,std::__cxx11::string>::
              variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                        ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff358);
              std::
              __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2aa40b);
              symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
              peVar8 = std::
                       __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2aa42a);
              symbol::Symbol::getId(peVar8);
              irGenerator::irGenerator::getVarName
                        (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                         in_stack_fffffffffffff3bc);
              std::variant<int,std::__cxx11::string>::
              variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                        ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff358);
              irGenerator::irGenerator::ir_ref
                        (in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                         in_stack_fffffffffffff4f0,(bool)begin);
              std::
              variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x2aa49a);
              std::__cxx11::string::~string(local_880);
              std::__cxx11::string::~string(local_8a0);
              std::
              variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x2aa4c1);
            }
            else {
              in_stack_fffffffffffff3c8 = (irGenerator *)(in_RSI + 0x20);
              std::variant<int,std::__cxx11::string>::
              variant<std::__cxx11::string&,void,void,std::__cxx11::string,void>
                        ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff358);
              in_stack_fffffffffffff3c0 = (string *)(in_RSI + 0x20);
              std::
              __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2aa261);
              symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
              peVar8 = std::
                       __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2aa280);
              in_stack_fffffffffffff3bc = symbol::Symbol::getId(peVar8);
              irGenerator::irGenerator::getVarName
                        (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                         in_stack_fffffffffffff3bc);
              std::variant<int,int,std::__cxx11::string>::
              variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                        ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff358);
              irGenerator::irGenerator::ir_assign
                        (in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                         in_stack_fffffffffffff4a0);
              std::
              variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~variant((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x2aa2ee);
              std::__cxx11::string::~string(local_7f0);
              std::__cxx11::string::~string(local_810);
              std::
              variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x2aa315);
            }
          }
        }
        std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2aa56d);
        symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
        peVar8 = std::
                 __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2aa58c);
        symbol::Symbol::getId(peVar8);
        irGenerator::irGenerator::getVarName
                  (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
        bVar1 = optimization::bmir_variable_table::BmirVariableTable::hasNameKey
                          ((BmirVariableTable *)
                           CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
                           (string *)in_stack_fffffffffffff358);
        uVar16 = (uint)bVar1 << 0x18;
        std::__cxx11::string::~string(local_8c0);
        std::__cxx11::string::~string(local_8e0);
        if ((uVar16 & 0x1000000) != 0) {
          std::__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2aa626);
          symbol::Symbol::getName_abi_cxx11_((Symbol *)in_stack_fffffffffffff358);
          peVar8 = std::
                   __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2aa645);
          iVar5 = symbol::Symbol::getId(peVar8);
          irGenerator::irGenerator::getVarName
                    (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
          optimization::bmir_variable_table::BmirVariableTable::getVarArray
                    ((BmirVariableTable *)CONCAT44(iVar5,in_stack_fffffffffffff360),
                     (string *)in_stack_fffffffffffff358);
          peVar13 = std::
                    __shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2aa694);
          peVar13->changed = true;
          std::__cxx11::string::~string(local_900);
          std::__cxx11::string::~string(local_920);
        }
        std::__cxx11::string::~string(local_608);
      }
    }
    std::shared_ptr<front::symbol::Symbol>::~shared_ptr
              ((shared_ptr<front::symbol::Symbol> *)0x2aa76f);
  }
  local_15 = 1;
  std::__cxx11::string::~string(local_48);
  _Var14._M_pi = extraout_RDX;
  if ((local_15 & 1) == 0) {
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2aa7ca);
    _Var14._M_pi = extraout_RDX_00;
  }
  SVar15.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var14._M_pi;
  SVar15.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI
  ;
  return (SharedExNdPtr)
         SVar15.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_l_val(ValueMode mode) {
  SharedExNdPtr node(new ExpressNode());
  string name;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    SharedSyPtr arr = symbolTable.find_least_layer_symbol(name);
    SharedExNdPtr index;
    SharedExNdPtr child;
    SharedExNdPtr addr;
    node->_type = NodeType::VAR;
    node->_operation =
        (std::static_pointer_cast<ArraySymbol>(arr)->isParam() ||
                 (arr->getLayerNum() != _initLayerNum &&
                  !std::static_pointer_cast<ArraySymbol>(arr)->isConst())
             ? OperationType::PTR
             : OperationType::ARR);
    node->_name = (std::static_pointer_cast<ArraySymbol>(arr)->isConst()
                       ? irGenerator.getConstName(arr->getName(), arr->getId())
                       : irGenerator.getVarName(arr->getName(), arr->getId()));
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      child = gm_exp();
      node->addChild(child);
      match_one_word(Token::RBRACK);
    }

    addr = computeIndex(arr, node);

    if (mode == ValueMode::left ||
        node->_children.size() <
            std::static_pointer_cast<ArraySymbol>(arr)->_dimensions.size()) {
      node = addr;
    } else if (std::static_pointer_cast<ArraySymbol>(arr)->isConst() &&
               addr->_children.back()->_type == NodeType::CNS) {
      SharedExNdPtr constValue;

      constValue = SharedExNdPtr(new ExpressNode());
      constValue->_type = NodeType::CNS;
      constValue->_operation = OperationType::NUMBER;
      constValue->_value =
          std::static_pointer_cast<ArraySymbol>(arr)
              ->_values.at(addr->_children.back()->_children.front()->_value)
              ->_value;
      node = constValue;
    } else {
      SharedExNdPtr loadValue;
      string value;

      value = irGenerator.getNewTmpValueName(TyKind::Int);
      loadValue = SharedExNdPtr(new ExpressNode());
      loadValue->_type = NodeType::VAR;
      loadValue->_operation = OperationType::LOAD;
      loadValue->_name = value;
      loadValue->addChild(addr);
      node = loadValue;

      irGenerator.ir_load(value, addr->_name);
    }

    if (mode == ValueMode::left) {
      if (bmirVariableTable.hasNameKey(
              irGenerator.getVarName(arr->getName(), arr->getId()))) {
        bmirVariableTable
            .getVarArray(irGenerator.getVarName(arr->getName(), arr->getId()))
            ->changed = true;
      }
    }
  } else {
    SharedSyPtr var = symbolTable.find_least_layer_symbol(name);

    if (var->kind() == SymbolKind::INT) {
      if (std::static_pointer_cast<IntSymbol>(var)->isConst()) {
        node->_type = NodeType::CNS;
        node->_operation = OperationType::VAR;
        node->_value = std::static_pointer_cast<IntSymbol>(var)->getValue();
      } else {
        node->_type = NodeType::VAR;
        node->_operation = OperationType::VAR;
        node->_name = irGenerator.getVarName(var->getName(), var->getId());
        if (var->getLayerNum() == _initLayerNum) {
          SharedExNdPtr addr;
          string addrTmp;

          addrTmp = irGenerator.getNewTmpValueName(TyKind::Ptr);
          addr = SharedExNdPtr(new ExpressNode());
          addr->_type = NodeType::VAR;
          addr->_operation = OperationType::PTR;
          addr->_name = addrTmp;
          addr->addChild(node);

          irGenerator.ir_ref(addrTmp, node->_name);

          if (mode == ValueMode::left) {
            node = addr;
          } else {
            SharedExNdPtr value;
            string valueTmp;

            valueTmp = irGenerator.getNewTmpValueName(TyKind::Int);
            value = SharedExNdPtr(new ExpressNode());
            value->_type = NodeType::VAR;
            value->_operation = OperationType::LOAD;
            value->_name = valueTmp;
            value->addChild(addr);

            irGenerator.ir_load(value->_name, addr->_name);
            node = value;
          }
        }

        if (mode == ValueMode::left) {
          if (bmirVariableTable.hasVarSingle(
                  irGenerator.getVarName(var->getName(), var->getId()))) {
            bmirVariableTable
                .getVarSingle(
                    irGenerator.getVarName(var->getName(), var->getId()))
                ->changed = true;
          }
        }
      }
    } else if (var->kind() == SymbolKind::Array) {
      string arrPtr;

      // The existing of arr name alone which must be the param to func
      arrPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);
      node->_type = NodeType::VAR;
      node->_operation = OperationType::PTR;
      node->_name = arrPtr;

      if (std::static_pointer_cast<ArraySymbol>(var)->isConst()) {
        irGenerator.ir_ref(
            arrPtr, irGenerator.getConstName(var->getName(), var->getId()));
      } else if (std::static_pointer_cast<ArraySymbol>(var)->isParam()) {
        irGenerator.ir_assign(
            arrPtr, irGenerator.getVarName(var->getName(), var->getId()));
      } else if (var->getLayerNum() != _initLayerNum &&
                 !std::static_pointer_cast<ArraySymbol>(var)->isConst()) {
        irGenerator.ir_assign(
            arrPtr, irGenerator.getVarName(var->getName(), var->getId()));
      } else {
        irGenerator.ir_ref(
            arrPtr, irGenerator.getVarName(var->getName(), var->getId()));
      }

      if (bmirVariableTable.hasNameKey(
              irGenerator.getVarName(var->getName(), var->getId()))) {
        bmirVariableTable
            .getVarArray(irGenerator.getVarName(var->getName(), var->getId()))
            ->changed = true;
      }
    }
  }

  return node;
}